

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O2

void __thiscall
spvtools::opt::LoopDependenceAnalysis::MarkUnsusedDistanceEntriesAsIrrelevant
          (LoopDependenceAnalysis *this,Instruction *source,Instruction *destination,
          DistanceVector *distance_vector)

{
  ScalarEvolutionAnalysis *pSVar1;
  pointer ppLVar2;
  pointer ppSVar3;
  LoopDependenceAnalysis *pLVar4;
  DistanceVector *pDVar5;
  SENode *pSVar6;
  iterator iVar7;
  pointer ppIVar8;
  long lVar9;
  size_t i;
  pointer ppSVar10;
  ulong uVar11;
  long lVar12;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  recurrent_nodes;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  destination_subscripts;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
  source_subscripts;
  Loop *local_c8;
  _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  local_c0;
  LoopDependenceAnalysis *local_a8;
  DistanceVector *local_a0;
  ScalarEvolutionAnalysis *local_98;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_90
  ;
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  local_78;
  _Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> local_48
  ;
  
  local_a0 = distance_vector;
  GetSubscripts((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)&local_48,this,source);
  GetSubscripts((vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
                 *)&local_90,this,destination);
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl._0_8_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar1 = &this->scalar_evolution_;
  local_a8 = this;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  for (ppIVar8 = local_48._M_impl.super__Vector_impl_data._M_start;
      ppIVar8 != local_48._M_impl.super__Vector_impl_data._M_finish; ppIVar8 = ppIVar8 + 1) {
    pSVar6 = ScalarEvolutionAnalysis::AnalyzeInstruction(pSVar1,*ppIVar8);
    pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar6);
    SENode::CollectRecurrentNodes
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&local_c0,pSVar6);
    ppSVar3 = local_c0._M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar10 = local_c0._M_impl.super__Vector_impl_data._M_start; ppSVar10 != ppSVar3;
        ppSVar10 = ppSVar10 + 1) {
      local_c8 = (*ppSVar10)->loop_;
      std::
      _Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
      ::_M_insert_unique<spvtools::opt::Loop_const*>
                ((_Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
                  *)&local_78,&local_c8);
    }
    std::
    _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~_Vector_base(&local_c0);
  }
  local_98 = pSVar1;
  for (ppIVar8 = local_90._M_impl.super__Vector_impl_data._M_start; pSVar1 = local_98,
      pDVar5 = local_a0, pLVar4 = local_a8,
      ppIVar8 != local_90._M_impl.super__Vector_impl_data._M_finish; ppIVar8 = ppIVar8 + 1) {
    pSVar6 = ScalarEvolutionAnalysis::AnalyzeInstruction(local_98,*ppIVar8);
    pSVar6 = ScalarEvolutionAnalysis::SimplifyExpression(pSVar1,pSVar6);
    SENode::CollectRecurrentNodes
              ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&local_c0,pSVar6);
    ppSVar3 = local_c0._M_impl.super__Vector_impl_data._M_finish;
    for (ppSVar10 = local_c0._M_impl.super__Vector_impl_data._M_start; ppSVar10 != ppSVar3;
        ppSVar10 = ppSVar10 + 1) {
      local_c8 = (*ppSVar10)->loop_;
      std::
      _Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
      ::_M_insert_unique<spvtools::opt::Loop_const*>
                ((_Rb_tree<spvtools::opt::Loop_const*,spvtools::opt::Loop_const*,std::_Identity<spvtools::opt::Loop_const*>,std::less<spvtools::opt::Loop_const*>,std::allocator<spvtools::opt::Loop_const*>>
                  *)&local_78,&local_c8);
    }
    std::
    _Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
    ::~_Vector_base(&local_c0);
  }
  lVar9 = 0;
  lVar12 = 0;
  for (uVar11 = 0;
      ppLVar2 = (pLVar4->loops_).
                super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                ._M_impl.super__Vector_impl_data._M_start,
      uVar11 < (ulong)((long)(pLVar4->loops_).
                             super__Vector_base<const_spvtools::opt::Loop_*,_std::allocator<const_spvtools::opt::Loop_*>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3);
      uVar11 = uVar11 + 1) {
    iVar7 = std::
            _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
            ::find(&local_78,(key_type *)((long)ppLVar2 + lVar9));
    if ((_Rb_tree_header *)iVar7._M_node == &local_78._M_impl.super__Rb_tree_header) {
      *(undefined4 *)
       ((long)&((pDVar5->entries).
                super__Vector_base<spvtools::opt::DistanceEntry,_std::allocator<spvtools::opt::DistanceEntry>_>
                ._M_impl.super__Vector_impl_data._M_start)->dependence_information + lVar12) = 4;
    }
    lVar12 = lVar12 + 0x28;
    lVar9 = lVar9 + 8;
  }
  std::
  _Rb_tree<const_spvtools::opt::Loop_*,_const_spvtools::opt::Loop_*,_std::_Identity<const_spvtools::opt::Loop_*>,_std::less<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  ::~_Rb_tree(&local_78);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_90);
  std::_Vector_base<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
  ~_Vector_base(&local_48);
  return;
}

Assistant:

void LoopDependenceAnalysis::MarkUnsusedDistanceEntriesAsIrrelevant(
    const Instruction* source, const Instruction* destination,
    DistanceVector* distance_vector) {
  std::vector<Instruction*> source_subscripts = GetSubscripts(source);
  std::vector<Instruction*> destination_subscripts = GetSubscripts(destination);

  std::set<const Loop*> used_loops{};

  for (Instruction* source_inst : source_subscripts) {
    SENode* source_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(source_inst));
    std::vector<SERecurrentNode*> recurrent_nodes =
        source_node->CollectRecurrentNodes();
    for (SERecurrentNode* recurrent_node : recurrent_nodes) {
      used_loops.insert(recurrent_node->GetLoop());
    }
  }

  for (Instruction* destination_inst : destination_subscripts) {
    SENode* destination_node = scalar_evolution_.SimplifyExpression(
        scalar_evolution_.AnalyzeInstruction(destination_inst));
    std::vector<SERecurrentNode*> recurrent_nodes =
        destination_node->CollectRecurrentNodes();
    for (SERecurrentNode* recurrent_node : recurrent_nodes) {
      used_loops.insert(recurrent_node->GetLoop());
    }
  }

  for (size_t i = 0; i < loops_.size(); ++i) {
    if (used_loops.find(loops_[i]) == used_loops.end()) {
      distance_vector->GetEntries()[i].dependence_information =
          DistanceEntry::DependenceInformation::IRRELEVANT;
    }
  }
}